

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widget.c
# Opt level: O0

void text_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ugui_rect_t *puVar5;
  size_t sVar6;
  uint uVar7;
  ugui_point_t local_94;
  int local_90;
  short local_8a;
  int i;
  ushort local_84;
  uint16_t alignment_offset;
  uint16_t offset;
  uint16_t line_count;
  uint16_t line_index;
  uint16_t len;
  uint16_t max_text_lines;
  uint16_t max_text_width;
  ugui_size_t text_size;
  uint8_t line_buff [64];
  ugui_rect_t *bounds;
  ugui_text_widget_t *text_widget;
  void *layer_ctx_local;
  void *graphics_ctx_local;
  ugui_layer_t *layer_local;
  
  puVar5 = ugui_layer_get_bounds(layer);
  ugui_font_get_text_size(*(font_style_t **)((long)layer_ctx + 8),"A",(ugui_size_t *)&line_index);
  uVar3 = (ushort)((ulong)puVar5->w / (ulong)(long)(int)(uint)line_index);
  uVar2 = puVar5->h;
  uVar7 = (uint)len;
  sVar6 = strlen(*(char **)((long)layer_ctx + 0x18));
  local_84 = 0;
  i._2_2_ = 0;
  local_8a = 0;
  for (i._0_2_ = 0;
      (ushort)i < (ushort)sVar6 && local_84 < (ushort)((ulong)uVar2 / (ulong)(long)(int)uVar7);
      i._0_2_ = (ushort)i + i._2_2_ + 1) {
    local_90 = 0;
    while (((uVar4 = i._2_2_, local_90 < (int)(uint)uVar3 &&
            (uVar4 = (ushort)local_90, (int)((uint)(ushort)i + local_90) < (int)(uint)(ushort)sVar6)
            ) && (*(char *)(*(long *)((long)layer_ctx + 0x18) +
                           (long)(int)((uint)(ushort)i + local_90)) != '\n'))) {
      if (*(char *)(*(long *)((long)layer_ctx + 0x18) + (long)(int)((uint)(ushort)i + local_90)) ==
          ' ') {
        i._2_2_ = uVar4;
      }
      local_90 = local_90 + 1;
    }
    i._2_2_ = uVar4;
    strncpy((char *)&max_text_lines,(char *)(*(long *)((long)layer_ctx + 0x18) + (ulong)(ushort)i),
            (ulong)i._2_2_);
    *(undefined1 *)((long)&max_text_lines + (ulong)i._2_2_) = 0;
    cVar1 = *(char *)((long)layer_ctx + 0x10);
    if (cVar1 == '\0') {
      local_8a = 0;
    }
    else if (cVar1 == '\x01') {
      local_8a = (short)((int)((uint)uVar3 - (uint)i._2_2_) / 2);
    }
    else if (cVar1 == '\x02') {
      local_8a = uVar3 - i._2_2_;
    }
    local_94.y = local_84 * len;
    local_94.x = local_8a * line_index;
    ugui_graphics_draw_text
              ((ugui_graphics_t *)graphics_ctx,(char *)&max_text_lines,
               *(font_style_t **)((long)layer_ctx + 8),local_94);
    local_84 = local_84 + 1;
  }
  return;
}

Assistant:

static void text_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
    ugui_text_widget_t* text_widget = (ugui_text_widget_t*) layer_ctx;
    ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

    uint8_t line_buff[64];

    ugui_size_t text_size;
    // TODO: dirty hack will only support monospace fonts
    ugui_font_get_text_size(text_widget->font,
                            "A",
                            &text_size);

    uint16_t max_text_width = bounds->w / text_size.w;
    uint16_t max_text_lines = bounds->h / text_size.h;

    uint16_t len = strlen(text_widget->text);

    uint16_t line_index = 0;
    uint16_t line_count = 0;
    uint16_t offset = 0;
    uint16_t alignment_offset = 0;

    while ((offset < len) && (line_index < max_text_lines)) {

        // Determine line length
        for (int i = 0; i < max_text_width; i++) {
            // Handle end of text
            if ((offset + i) >= len) {
                line_count = i;
                break;
            }

            // Handle newlines
            if (text_widget->text[offset + i] == '\n') {
                line_count = i;
                break;
            }

            // Insert linebreaks up to spaces.
            if (text_widget->text[offset + i] == ' ') {
                line_count = i;
            }
        }

        // Copy line into line buffer for rendering
        strncpy(line_buff, text_widget->text + offset, line_count);
        line_buff[line_count] = '\0';

        // Calculate offset for alignment modes
        switch (text_widget->alignment) {
        case UGUI_TEXT_ALIGN_LEFT:
            alignment_offset = 0;
            break;
        case UGUI_TEXT_ALIGN_CENTER:
            alignment_offset = (max_text_width - line_count) / 2;
            break;
        case UGUI_TEXT_ALIGN_RIGHT:
            alignment_offset = (max_text_width - line_count);
            break;
        }

        ugui_graphics_draw_text(graphics_ctx,
                                line_buff,
                                text_widget->font,
        (ugui_point_t) {
            .x = alignment_offset * text_size.w, .y = line_index * text_size.h
        });

        offset += line_count + 1;
        line_index += 1;
    }
}